

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceType.h
# Opt level: O0

optional<libchess::PieceType> libchess::PieceType::from(char c)

{
  optional<libchess::PieceType> *this;
  char in_DIL;
  undefined4 in_stack_ffffffffffffffc8;
  value_type in_stack_ffffffffffffffcc;
  _Optional_base<libchess::PieceType,_true,_true> local_8;
  
  this = (optional<libchess::PieceType> *)(ulong)((int)in_DIL - 0x42);
  switch(this) {
  case (optional<libchess::PieceType> *)0x0:
  case (optional<libchess::PieceType> *)0x20:
    PieceType((PieceType *)this,in_stack_ffffffffffffffcc);
    std::optional<libchess::PieceType>::optional<libchess::PieceType,_true>
              (this,(PieceType *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  default:
    std::optional<libchess::PieceType>::optional((optional<libchess::PieceType> *)0x10d815);
    break;
  case (optional<libchess::PieceType> *)0x9:
  case (optional<libchess::PieceType> *)0x29:
    PieceType((PieceType *)this,in_stack_ffffffffffffffcc);
    std::optional<libchess::PieceType>::optional<libchess::PieceType,_true>
              (this,(PieceType *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (optional<libchess::PieceType> *)0xc:
  case (optional<libchess::PieceType> *)0x2c:
    PieceType((PieceType *)this,in_stack_ffffffffffffffcc);
    std::optional<libchess::PieceType>::optional<libchess::PieceType,_true>
              (this,(PieceType *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (optional<libchess::PieceType> *)0xe:
  case (optional<libchess::PieceType> *)0x2e:
    PieceType((PieceType *)this,in_stack_ffffffffffffffcc);
    std::optional<libchess::PieceType>::optional<libchess::PieceType,_true>
              (this,(PieceType *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (optional<libchess::PieceType> *)0xf:
  case (optional<libchess::PieceType> *)0x2f:
    PieceType((PieceType *)this,in_stack_ffffffffffffffcc);
    std::optional<libchess::PieceType>::optional<libchess::PieceType,_true>
              (this,(PieceType *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    break;
  case (optional<libchess::PieceType> *)0x10:
  case (optional<libchess::PieceType> *)0x30:
    PieceType((PieceType *)this,in_stack_ffffffffffffffcc);
    std::optional<libchess::PieceType>::optional<libchess::PieceType,_true>
              (this,(PieceType *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return (_Optional_base<libchess::PieceType,_true,_true>)
         (_Optional_base<libchess::PieceType,_true,_true>)
         local_8._M_payload.super__Optional_payload_base<libchess::PieceType>;
}

Assistant:

constexpr static std::optional<PieceType> from(char c) {
        switch (c) {
        case 'p':
        case 'P':
            return PieceType{Value::PAWN};
        case 'n':
        case 'N':
            return PieceType{Value::KNIGHT};
        case 'b':
        case 'B':
            return PieceType{Value::BISHOP};
        case 'r':
        case 'R':
            return PieceType{Value::ROOK};
        case 'q':
        case 'Q':
            return PieceType{Value::QUEEN};
        case 'k':
        case 'K':
            return PieceType{Value::KING};
        default:
            return {};
        }
    }